

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11.hpp
# Opt level: O2

ParseOutput __thiscall
helics::helicsCLI11App::helics_parse<char_const(&)[3]>(helicsCLI11App *this,char (*args) [3])

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  Option *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,*args,(allocator<char> *)&bStack_88);
  CLI::App::parse(&this->super_App,&local_68,false);
  std::__cxx11::string::~string((string *)&local_68);
  this->last_output = OK;
  CLI::App::remaining_for_passthrough_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&bStack_88,&this->super_App,false);
  this_00 = &this->remArgs;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(this_00,&bStack_88);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&bStack_88);
  if (this->passConfig == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"--config",(allocator<char> *)&bStack_88);
    this_01 = CLI::App::get_option_no_throw(&this->super_App,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if ((this_01 != (Option *)0x0) &&
       ((this_01->results_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this_01->results_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)) {
      CLI::Option::as<std::__cxx11::string>(&bStack_88,this_01);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &bStack_88);
      std::__cxx11::string::~string((string *)&bStack_88);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[9]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [9])0x36eb56);
    }
  }
  return this->last_output;
}

Assistant:

ParseOutput helics_parse(Args&&... args) noexcept
    {
        try {
            parse(std::forward<Args>(args)...);
            last_output = ParseOutput::OK;
            remArgs = remaining_for_passthrough();
            if (passConfig) {
                auto* opt = get_option_no_throw("--config");
                if (opt != nullptr && opt->count() > 0) {
                    remArgs.push_back(opt->as<std::string>());
                    remArgs.emplace_back("--config");
                }
            }
        }
        catch (const CLI::CallForHelp& ch) {
            if (!quiet) {
                exit(ch);
            }
            last_output = ParseOutput::HELP_CALL;
        }
        catch (const CLI::CallForAllHelp& ca) {
            if (!quiet) {
                exit(ca);
            }
            last_output = ParseOutput::HELP_ALL_CALL;
        }
        catch (const CLI::CallForVersion& cv) {
            if (!quiet) {
                exit(cv);
            }
            last_output = ParseOutput::VERSION_CALL;
        }
        catch (const CLI::Success& /*sc*/) {
            last_output = ParseOutput::SUCCESS_TERMINATION;
        }
        catch (const CLI::Error& ce) {
            CLI::App::exit(ce);
            last_output = ParseOutput::PARSE_ERROR;
        }
        catch (...) {
            last_output = ParseOutput::PARSE_ERROR;
        }
        return last_output;
    }